

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setDirectoryUrl(QFileDialog *this,QUrl *directory)

{
  long lVar1;
  bool bVar2;
  QFileDialogPrivate *file;
  ulong uVar3;
  QFileDialogOptions *pQVar4;
  QMessageLogger *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QUrl *in_stack_ffffffffffffff98;
  char local_40 [8];
  QString *in_stack_ffffffffffffffc8;
  QFileDialog *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QFileDialog *)0x74f57f);
  uVar3 = QUrl::isValid();
  if ((uVar3 & 1) != 0) {
    QFileDialogPrivate::setLastVisitedDirectory((QUrl *)in_RDI);
    pQVar4 = QSharedPointer<QFileDialogOptions>::operator->
                       ((QSharedPointer<QFileDialogOptions> *)0x74f5b2);
    QFileDialogOptions::setInitialDirectory((QUrl *)pQVar4);
    if (((file->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
      uVar3 = QUrl::isLocalFile();
      if ((uVar3 & 1) == 0) {
        bVar2 = QFileDialogPrivate::usingWidgets(in_RDI);
        if (bVar2) {
          QMessageLogger::QMessageLogger
                    (in_RSI,(char *)file,(int)((ulong)in_RDI >> 0x20),
                     (char *)in_stack_ffffffffffffff98);
          QMessageLogger::warning(local_40,"Non-native QFileDialog supports only local files");
        }
      }
      else {
        QUrl::toLocalFile();
        setDirectory(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        QString::~QString((QString *)0x74f616);
      }
    }
    else {
      QFileDialogPrivate::setDirectory_sys(in_RDI,in_stack_ffffffffffffff98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::setDirectoryUrl(const QUrl &directory)
{
    Q_D(QFileDialog);
    if (!directory.isValid())
        return;

    QFileDialogPrivate::setLastVisitedDirectory(directory);
    d->options->setInitialDirectory(directory);

    if (d->nativeDialogInUse)
        d->setDirectory_sys(directory);
    else if (directory.isLocalFile())
        setDirectory(directory.toLocalFile());
    else if (Q_UNLIKELY(d->usingWidgets()))
        qWarning("Non-native QFileDialog supports only local files");
}